

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Loop::GetExitBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *exit_blocks)

{
  IRContext *this_00;
  CFG *this_01;
  BasicBlock *this_02;
  _Hash_node_base *p_Var1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&exit_blocks->_M_h);
  p_Var1 = (this->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      this_02 = CFG::block(this_01,*(uint32_t *)&p_Var1[1]._M_nxt);
      local_38 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:358:31)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:358:31)>
                 ::_M_manager;
      local_50._M_unused._M_object = exit_blocks;
      local_50._8_8_ = this;
      BasicBlock::ForEachSuccessorLabel(this_02,(function<void_(unsigned_int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Loop::GetExitBlocks(std::unordered_set<uint32_t>* exit_blocks) const {
  CFG* cfg = context_->cfg();
  exit_blocks->clear();

  for (uint32_t bb_id : GetBlocks()) {
    const BasicBlock* bb = cfg->block(bb_id);
    bb->ForEachSuccessorLabel([exit_blocks, this](uint32_t succ) {
      if (!IsInsideLoop(succ)) {
        exit_blocks->insert(succ);
      }
    });
  }
}